

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O3

void FACT_INTERNAL_BeginFadeOut(FACTSoundInstance *sound,uint16_t fadeOutMS)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  undefined2 in_register_00000032;
  
  if (CONCAT22(in_register_00000032,fadeOutMS) != 0) {
    sound->fadeType = '\x02';
    uVar2 = FAudio_timems();
    sound->fadeStart = uVar2;
    sound->fadeTarget = fadeOutMS;
    puVar1 = &sound->parentCue->state;
    *puVar1 = *puVar1 | 0x10;
    return;
  }
  FACT_INTERNAL_DestroySound(sound);
  return;
}

Assistant:

void FACT_INTERNAL_BeginFadeOut(FACTSoundInstance *sound, uint16_t fadeOutMS)
{
	if (fadeOutMS == 0)
	{
		/* No fade? Screw it, just delete us */
		FACT_INTERNAL_DestroySound(sound);
		return;
	}

	sound->fadeType = 2; /* Out */
	sound->fadeStart = FAudio_timems();
	sound->fadeTarget = fadeOutMS;

	sound->parentCue->state |= FACT_STATE_STOPPING;
}